

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O3

HelicsBool helicsInputGetBoolean(HelicsInput inp,HelicsError *err)

{
  undefined8 in_RAX;
  InputObject *pIVar1;
  uint uVar2;
  bool val;
  byte local_11;
  
  local_11 = (byte)((ulong)in_RAX >> 0x38);
  pIVar1 = anon_unknown.dwarf_7c49a::verifyInput(inp,err);
  uVar2 = 0;
  if (pIVar1 != (InputObject *)0x0) {
    helics::Input::getValue_impl<bool>(pIVar1->inputPtr,&local_11);
    uVar2 = (uint)local_11;
  }
  return uVar2;
}

Assistant:

HelicsBool helicsInputGetBoolean(HelicsInput inp, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);
    if (inpObj == nullptr) {
        return HELICS_FALSE;
    }
    try {
        const bool boolval = inpObj->inputPtr->getValue<bool>();
        return (boolval) ? HELICS_TRUE : HELICS_FALSE;
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return HELICS_FALSE;
    }
    // LCOV_EXCL_STOP
}